

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

vector<std::pair<unsigned_int,_double>,_std::allocator<std::pair<unsigned_int,_double>_>_> *
get_vps(vector<std::pair<unsigned_int,_double>,_std::allocator<std::pair<unsigned_int,_double>_>_>
        *__return_storage_ptr__,Matrix<double> *mat,uint col,uint beg_row,uint end_row)

{
  uint uVar1;
  Shape SVar2;
  double local_60;
  undefined8 local_58;
  undefined1 local_50;
  undefined8 local_38;
  undefined1 local_30;
  uint local_2c;
  undefined1 local_25;
  uint i;
  uint local_20;
  uint end_row_local;
  uint beg_row_local;
  uint col_local;
  Matrix<double> *mat_local;
  vector<std::pair<unsigned_int,_double>,_std::allocator<std::pair<unsigned_int,_double>_>_> *vps;
  
  local_25 = 0;
  i = end_row;
  local_20 = beg_row;
  end_row_local = col;
  _beg_row_local = mat;
  mat_local = (Matrix<double> *)__return_storage_ptr__;
  std::vector<std::pair<unsigned_int,_double>,_std::allocator<std::pair<unsigned_int,_double>_>_>::
  vector(__return_storage_ptr__);
  local_2c = local_20;
  while( true ) {
    uVar1 = local_2c;
    SVar2 = Matrix<double>::shape(_beg_row_local);
    local_58 = SVar2._0_8_;
    local_50 = SVar2.is_diogonal;
    local_38._0_4_ = SVar2.n_row;
    if ((uint)local_38 <= uVar1 || i <= local_2c) break;
    local_38 = local_58;
    local_30 = local_50;
    local_60 = Matrix<double>::get(_beg_row_local,local_2c,end_row_local);
    std::vector<std::pair<unsigned_int,double>,std::allocator<std::pair<unsigned_int,double>>>::
    emplace_back<unsigned_int&,double>
              ((vector<std::pair<unsigned_int,double>,std::allocator<std::pair<unsigned_int,double>>>
                *)__return_storage_ptr__,&local_2c,&local_60);
    local_2c = local_2c + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<unsigned, double>> get_vps(const Matrix_d& mat, unsigned col, unsigned beg_row, unsigned end_row){
    std::vector<std::pair<unsigned, double>> vps;

    for(unsigned i=beg_row;i<mat.shape().n_row && i<end_row;++i){
        vps.emplace_back(i,mat.get(i,col));
    }

    return vps;
}